

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O1

Vec_Int_t * Gia_PolynCoreCollect(Gia_Man_t *pGia,Vec_Int_t *vAdds,Vec_Int_t *vOrder)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  bool bVar5;
  uint uVar6;
  Vec_Int_t *vNodes;
  int *piVar7;
  Vec_Bit_t *vVisited;
  int iVar8;
  long lVar9;
  
  vNodes = (Vec_Int_t *)malloc(0x10);
  vNodes->nCap = 1000;
  vNodes->nSize = 0;
  piVar7 = (int *)malloc(4000);
  vNodes->pArray = piVar7;
  iVar8 = ((pGia->nObjs >> 5) + 1) - (uint)((pGia->nObjs & 0x1fU) == 0);
  vVisited = (Vec_Bit_t *)malloc(0x10);
  vVisited->nSize = 0;
  vVisited->nCap = iVar8 * 0x20;
  if (iVar8 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar8 * 4);
  }
  vVisited->pArray = piVar7;
  vVisited->nSize = iVar8 * 0x20;
  memset(piVar7,0,(long)iVar8 << 2);
  lVar9 = (long)vOrder->nSize;
  if (0 < (long)vOrder->nSize) {
    do {
      if ((vOrder->nSize < lVar9) || (iVar8 = vOrder->pArray[lVar9 + -1], iVar8 < 0)) {
LAB_0065dc51:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar6 = iVar8 * 6;
      uVar1 = vAdds->nSize;
      if ((uVar1 == uVar6 || SBORROW4(uVar1,uVar6) != (int)(uVar1 + iVar8 * -6) < 0) ||
         (((int)uVar1 <= (int)(uVar6 | 1) || ((int)uVar1 <= (int)(uVar6 + 2))))) goto LAB_0065dc51;
      piVar7 = vAdds->pArray;
      uVar1 = piVar7[uVar6];
      if (((int)uVar1 < 0) || (vVisited->nSize <= (int)uVar1)) {
LAB_0065dc70:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
      }
      uVar2 = piVar7[uVar6 | 1];
      uVar3 = piVar7[uVar6 + 2];
      piVar4 = vVisited->pArray;
      piVar4[uVar1 >> 5] = piVar4[uVar1 >> 5] | 1 << ((byte)uVar1 & 0x1f);
      if (((((int)uVar2 < 0) || (vVisited->nSize <= (int)uVar2)) ||
          (piVar4[uVar2 >> 5] = piVar4[uVar2 >> 5] | 1 << ((byte)uVar2 & 0x1f), (int)uVar3 < 0)) ||
         (vVisited->nSize <= (int)uVar3)) goto LAB_0065dc70;
      piVar4[uVar3 >> 5] = piVar4[uVar3 >> 5] | 1 << ((byte)uVar3 & 0x1f);
      if ((vAdds->nSize <= (int)(uVar6 + 3)) || (vAdds->nSize <= (int)(uVar6 + 4)))
      goto LAB_0065dc51;
      iVar8 = piVar7[uVar6 + 4];
      Gia_PolynCoreCollect_rec(pGia,piVar7[uVar6 + 3],vNodes,vVisited);
      Gia_PolynCoreCollect_rec(pGia,iVar8,vNodes,vVisited);
      bVar5 = 1 < lVar9;
      lVar9 = lVar9 + -1;
    } while (bVar5);
  }
  if (vVisited->pArray != (int *)0x0) {
    free(vVisited->pArray);
    vVisited->pArray = (int *)0x0;
  }
  free(vVisited);
  return vNodes;
}

Assistant:

Vec_Int_t * Gia_PolynCoreCollect( Gia_Man_t * pGia, Vec_Int_t * vAdds, Vec_Int_t * vOrder )
{
    Vec_Int_t * vNodes = Vec_IntAlloc( 1000 );
    Vec_Bit_t * vVisited = Vec_BitStart( Gia_ManObjNum(pGia) );
    int i, Index, Entry1, Entry2, Entry3;
    Vec_IntForEachEntryReverse( vOrder, Index, i )
    {
        // mark inputs
        Entry1 = Vec_IntEntry( vAdds, 6*Index + 0 );
        Entry2 = Vec_IntEntry( vAdds, 6*Index + 1 );
        Entry3 = Vec_IntEntry( vAdds, 6*Index + 2 );
        Vec_BitWriteEntry( vVisited, Entry1, 1 );
        Vec_BitWriteEntry( vVisited, Entry2, 1 );
        Vec_BitWriteEntry( vVisited, Entry3, 1 );
        // traverse from outputs
        Entry1 = Vec_IntEntry( vAdds, 6*Index + 3 );
        Entry2 = Vec_IntEntry( vAdds, 6*Index + 4 );
        Gia_PolynCoreCollect_rec( pGia, Entry1, vNodes, vVisited );
        Gia_PolynCoreCollect_rec( pGia, Entry2, vNodes, vVisited );
    }
    Vec_BitFree( vVisited );
    return vNodes;
}